

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::SetToSlackBasis(Basis *this)

{
  Int IVar1;
  Int IVar2;
  reference pvVar3;
  long in_RDI;
  Int err;
  Int i_1;
  Int j;
  Int i;
  Int n;
  Int m;
  Basis *in_stack_00000100;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  IVar1 = Model::rows(*(Model **)(in_RDI + 8));
  IVar2 = Model::cols(*(Model **)(in_RDI + 8));
  for (local_14 = 0; local_14 < IVar1; local_14 = local_14 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_14);
    *pvVar3 = IVar2 + local_14;
  }
  for (local_18 = 0; local_18 < IVar2; local_18 = local_18 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_18);
    *pvVar3 = -1;
  }
  for (local_1c = 0; local_1c < IVar1; local_1c = local_1c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),
                        (long)(IVar2 + local_1c));
    *pvVar3 = local_1c;
  }
  Factorize(in_stack_00000100);
  return;
}

Assistant:

void Basis::SetToSlackBasis() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    for (Int i = 0; i < m; i++)
        basis_[i] = n+i;
    for (Int j = 0; j < n; j++)
        map2basis_[j] = -1;
    for (Int i = 0; i < m; i++)
        map2basis_[n+i] = i;
    Int err = Factorize();
    // factorization of slack basis cannot fail other than out of memory
    assert(err == 0);
}